

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O0

ExprPtr __thiscall mathiu::impl::operator+(impl *this,ExprPtr *lhs,ExprPtr *rhs)

{
  element_type *first;
  element_type *values;
  App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>
  *patterns_1;
  App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
  *patterns_1_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  anon_class_16_2_441f3103_for_mPred *pred;
  When<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:388:37)>
  WVar1;
  ExprPtr EVar2;
  PatternHelper<matchit::impl::Wildcard> local_1e89;
  anon_class_16_2_441c8d4f local_1e88;
  PatternPair<matchit::impl::Wildcard,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:423:58)>
  local_1e78;
  App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
  local_1e60;
  App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
  local_1e08;
  Ds<matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
  local_1db0;
  PatternHelper<matchit::impl::Ds<matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>
  local_1d00;
  anon_class_24_3_d2217d9a local_1c50;
  PatternPair<matchit::impl::Ds<matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:419:92)>
  local_1c38;
  Id<mathiu::impl::PieceWise> local_1b70;
  App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>
  local_1b40;
  Ds<matchit::impl::Wildcard,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>_>
  local_1af0;
  PatternHelper<matchit::impl::Ds<matchit::impl::Wildcard,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>_>_>
  local_1aa0;
  anon_class_16_2_2725c299 local_1a50;
  undefined1 local_1a40 [144];
  App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>
  local_19b0;
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>,_matchit::impl::Wildcard>
  local_1960;
  PatternHelper<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>,_matchit::impl::Wildcard>_>
  local_1910;
  anon_class_16_2_2725d91f local_18c0;
  PatternPair<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>,_matchit::impl::Wildcard>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:410:62)>
  local_18b0;
  Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_> local_1850;
  App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>
  local_1810;
  Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_> local_17b0;
  App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>
  local_1770;
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
  local_1710;
  PatternHelper<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>_>
  local_1650;
  anon_class_32_4_2436d155 local_1590;
  PatternPair<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:408:90)>
  local_1570;
  Id<int> local_1490;
  undefined1 local_1470 [128];
  App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>
  local_13f0;
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
  local_1390;
  PatternHelper<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>_>
  local_12f0;
  anon_class_24_3_fb195628 local_1250;
  undefined1 local_1238 [248];
  App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>
  local_1140;
  Id<int> local_10e0;
  App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>
  local_10c0;
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>
  local_1080;
  PatternHelper<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>_>
  local_fe0;
  anon_class_24_3_fb193fa2 local_f40;
  PatternPair<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:406:80)>
  local_f28;
  Id<int> local_e70;
  App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>
  local_e50;
  Id<int> local_e10;
  App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>
  local_df0;
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>
  local_db0;
  PatternHelper<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>_>
  local_d30;
  anon_class_16_2_441b116f local_cb0;
  undefined1 local_ca0 [216];
  App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>
  local_bc8;
  Ds<matchit::impl::Wildcard,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>
  local_b60;
  PatternHelper<matchit::impl::Ds<matchit::impl::Wildcard,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>_>
  local_af8;
  anon_class_16_2_441acab8 local_a90;
  undefined1 local_a80 [192];
  App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>
  local_9c0;
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_matchit::impl::Wildcard>
  local_958;
  PatternHelper<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_matchit::impl::Wildcard>_>
  local_8f0;
  anon_class_16_2_441ae084 local_888;
  PatternPair<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_matchit::impl::Wildcard>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:398:49)>
  local_878;
  Id<mathiu::impl::Sum> local_800;
  App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>
  local_7b8;
  Id<mathiu::impl::Sum> local_750;
  App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>
  local_708;
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>
  local_6a0;
  PatternHelper<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>_>
  local_5d0;
  anon_class_16_2_441abc2f local_500;
  PatternPair<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:395:60)>
  local_4f0;
  App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>_>
  local_410;
  Ds<matchit::impl::Wildcard,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>_>_>
  local_3e8;
  PatternHelper<matchit::impl::Ds<matchit::impl::Wildcard,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>_>_>_>
  local_3c0;
  Nullary<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:110:28)>
  local_398;
  undefined1 local_390 [48];
  App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>_>
  local_360;
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>_>,_matchit::impl::Wildcard>
  local_338;
  PatternHelper<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>_>,_matchit::impl::Wildcard>_>
  local_310;
  Nullary<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:110:28)>
  local_2e8;
  PatternPair<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>_>,_matchit::impl::Wildcard>,_matchit::impl::Nullary<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:110:28)>_>
  local_2e0;
  ExprPtr *local_2b0;
  ExprPtr *local_2a8;
  When<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:388:37)>
  local_2a0;
  PatternHelper<matchit::impl::Wildcard> local_289;
  PatternHelper<matchit::impl::PostCheck<matchit::impl::Wildcard,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:388:37)>_>
  local_288;
  anon_class_16_2_441f3103 local_270;
  undefined1 local_260 [40];
  undefined1 local_238 [24];
  Id<mathiu::impl::PieceWise> iPieceWise;
  Id<std::shared_ptr<const_mathiu::impl::Expr>_> rest;
  Id<std::shared_ptr<const_mathiu::impl::Expr>_> coeff2;
  Id<std::shared_ptr<const_mathiu::impl::Expr>_> coeff1;
  Id<int> ii4;
  Id<int> ii3;
  Id<int> ii2;
  Id<int> ii1;
  Id<int> iir;
  Id<int> iil;
  undefined1 local_b0 [8];
  Id<mathiu::impl::Sum> iSr;
  Id<mathiu::impl::Sum> iSl;
  ExprPtr *rhs_local;
  ExprPtr *lhs_local;
  
  matchit::impl::Id<mathiu::impl::Sum>::Id
            ((Id<mathiu::impl::Sum> *)
             ((long)&iSr.mBlock.
                     super__Variant_base<matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                     .
                     super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                     .
                     super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                     .
                     super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                     .
                     super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
             + 0x40));
  matchit::impl::Id<mathiu::impl::Sum>::Id((Id<mathiu::impl::Sum> *)local_b0);
  matchit::impl::Id<int>::Id
            ((Id<int> *)
             ((long)&iir.mBlock.
                     super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                     .
                     super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                     .
                     super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                     .
                     super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                     .
                     super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
             + 0x18));
  matchit::impl::Id<int>::Id
            ((Id<int> *)
             ((long)&ii1.mBlock.
                     super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                     .
                     super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                     .
                     super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                     .
                     super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                     .
                     super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
             + 0x18));
  matchit::impl::Id<int>::Id
            ((Id<int> *)
             ((long)&ii2.mBlock.
                     super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                     .
                     super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                     .
                     super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                     .
                     super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                     .
                     super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
             + 0x18));
  matchit::impl::Id<int>::Id
            ((Id<int> *)
             ((long)&ii3.mBlock.
                     super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                     .
                     super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                     .
                     super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                     .
                     super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                     .
                     super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
             + 0x18));
  matchit::impl::Id<int>::Id
            ((Id<int> *)
             ((long)&ii4.mBlock.
                     super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                     .
                     super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                     .
                     super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                     .
                     super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                     .
                     super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
             + 0x18));
  matchit::impl::Id<int>::Id
            ((Id<int> *)
             ((long)&coeff1.mBlock.
                     super__Variant_base<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                     .
                     super__Move_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                     .
                     super__Copy_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                     .
                     super__Move_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                     .
                     super__Copy_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
             + 0x20));
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::Id
            ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)
             ((long)&coeff2.mBlock.
                     super__Variant_base<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                     .
                     super__Move_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                     .
                     super__Copy_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                     .
                     super__Move_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                     .
                     super__Copy_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
             + 0x20));
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::Id
            ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)
             ((long)&rest.mBlock.
                     super__Variant_base<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                     .
                     super__Move_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                     .
                     super__Copy_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                     .
                     super__Move_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                     .
                     super__Copy_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
             + 0x20));
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::Id
            ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)
             ((long)&iPieceWise.mBlock.
                     super__Variant_base<matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
                     .
                     super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
                     .
                     super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
                     .
                     super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
                     .
                     super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
             + 0x28));
  matchit::impl::Id<mathiu::impl::PieceWise>::Id((Id<mathiu::impl::PieceWise> *)(local_238 + 0x10));
  first = std::
          __shared_ptr_access<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator*((__shared_ptr_access<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)lhs);
  values = std::
           __shared_ptr_access<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)rhs);
  matchit::impl::match<mathiu::impl::Expr_const&,mathiu::impl::Expr_const&>
            ((impl *)local_238,first,values);
  pred = (anon_class_16_2_441f3103_for_mPred *)&matchit::impl::_;
  local_270.rhs = rhs;
  local_270.lhs = lhs;
  matchit::impl::PatternPipable::operator|
            ((PatternPipable *)&matchit::impl::pattern,(Wildcard *)&matchit::impl::_);
  local_2b0 = rhs;
  local_2a8 = lhs;
  WVar1 = matchit::impl::operator+((impl *)&local_2b0,pred);
  local_2a0.mPred.lhs = WVar1.mPred.lhs;
  patterns_1 = (App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>
                *)WVar1.mPred.rhs;
  local_2a0.mPred.rhs = (ExprPtr *)patterns_1;
  matchit::impl::PatternHelper<matchit::impl::Wildcard>::operator+(&local_288,&local_289,&local_2a0)
  ;
  matchit::impl::
  PatternHelper<matchit::impl::PostCheck<matchit::impl::Wildcard,mathiu::impl::TEMPNAMEPLACEHOLDERVALUE(std::shared_ptr<mathiu::impl::Expr_const>const&,std::shared_ptr<mathiu::impl::Expr_const>const&)::$_0>>
  ::operator+((PatternPair<matchit::impl::PostCheck<matchit::impl::Wildcard,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:388:37)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:388:70)>
               *)local_260,
              (PatternHelper<matchit::impl::PostCheck<matchit::impl::Wildcard,mathiu::impl::TEMPNAMEPLACEHOLDERVALUE(std::shared_ptr<mathiu::impl::Expr_const>const&,std::shared_ptr<mathiu::impl::Expr_const>const&)::__0>>
               *)&local_288,&local_270);
  local_2e8 = matchit::impl::expr<std::shared_ptr<mathiu::impl::Expr_const>>(rhs);
  matchit::impl::as<int>::{lambda(auto:1)#1}::operator()
            ((App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>_>
              *)(local_390 + 0x30),(_lambda_auto_1__1_ *)&matchit::impl::as<int>,0);
  matchit::impl::
  ds<matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,int>>>,matchit::impl::Wildcard>
            (&local_338,(impl *)(local_390 + 0x30),
             (App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>_>
              *)&matchit::impl::_,(Wildcard *)patterns_1);
  matchit::impl::PatternPipable::operator|
            (&local_310,(PatternPipable *)&matchit::impl::pattern,&local_338);
  matchit::impl::
  PatternHelper<matchit::impl::Ds<matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,int>>>,matchit::impl::Wildcard>>
  ::operator=(&local_2e0,
              (PatternHelper<matchit::impl::Ds<matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,int>>>,matchit::impl::Wildcard>>
               *)&local_310,&local_2e8);
  local_398 = matchit::impl::expr<std::shared_ptr<mathiu::impl::Expr_const>>(lhs);
  matchit::impl::as<int>::{lambda(auto:1)#1}::operator()
            (&local_410,(_lambda_auto_1__1_ *)&matchit::impl::as<int>,0);
  matchit::impl::
  ds<matchit::impl::Wildcard,matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,int>>>>
            (&local_3e8,(impl *)&matchit::impl::_,(Wildcard *)&local_410,
             (App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>_>
              *)patterns_1);
  matchit::impl::PatternPipable::operator|
            (&local_3c0,(PatternPipable *)&matchit::impl::pattern,&local_3e8);
  matchit::impl::
  PatternHelper<matchit::impl::Ds<matchit::impl::Wildcard,matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,int>>>>>
  ::operator=((PatternPair<matchit::impl::Ds<matchit::impl::Wildcard,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>_>_>,_matchit::impl::Nullary<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:110:28)>_>
               *)local_390,
              (PatternHelper<matchit::impl::Ds<matchit::impl::Wildcard,matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,int>>>>>
               *)&local_3c0,&local_398);
  local_500.iSl =
       (Id<mathiu::impl::Sum> *)
       ((long)&iSr.mBlock.
               super__Variant_base<matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
               .
               super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
               .
               super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
               .
               super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
               .
               super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
       + 0x40);
  local_500.iSr = (Id<mathiu::impl::Sum> *)local_b0;
  matchit::impl::Id<mathiu::impl::Sum>::Id(&local_750,local_500.iSl);
  matchit::impl::as<mathiu::impl::Sum>::{lambda(auto:1)#1}::operator()
            (&local_708,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Sum>,&local_750);
  matchit::impl::Id<mathiu::impl::Sum>::Id(&local_800,(Id<mathiu::impl::Sum> *)local_b0);
  matchit::impl::as<mathiu::impl::Sum>::{lambda(auto:1)#1}::operator()
            (&local_7b8,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Sum>,&local_800);
  matchit::impl::
  ds<matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Sum>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<mathiu::impl::Sum>>>>,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Sum>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<mathiu::impl::Sum>>>>>
            (&local_6a0,(impl *)&local_708,&local_7b8,patterns_1);
  matchit::impl::PatternPipable::operator|
            (&local_5d0,(PatternPipable *)&matchit::impl::pattern,&local_6a0);
  matchit::impl::
  PatternHelper<matchit::impl::Ds<matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Sum>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Id<mathiu::impl::Sum>>>>,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Sum>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Id<mathiu::impl::Sum>>>>>>
  ::operator+(&local_4f0,
              (PatternHelper<matchit::impl::Ds<matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Sum>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<mathiu::impl::Sum>>>>,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Sum>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<mathiu::impl::Sum>>>>>>
               *)&local_5d0,&local_500);
  local_888.iSl =
       (Id<mathiu::impl::Sum> *)
       ((long)&iSr.mBlock.
               super__Variant_base<matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
               .
               super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
               .
               super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
               .
               super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
               .
               super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
       + 0x40);
  local_888.rhs = rhs;
  matchit::impl::Id<mathiu::impl::Sum>::Id
            ((Id<mathiu::impl::Sum> *)(local_a80 + 0x78),local_888.iSl);
  matchit::impl::as<mathiu::impl::Sum>::{lambda(auto:1)#1}::operator()
            (&local_9c0,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Sum>,
             (Id<mathiu::impl::Sum> *)(local_a80 + 0x78));
  matchit::impl::
  ds<matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Sum>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<mathiu::impl::Sum>>>>,matchit::impl::Wildcard>
            (&local_958,(impl *)&local_9c0,
             (App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>
              *)&matchit::impl::_,(Wildcard *)patterns_1);
  matchit::impl::PatternPipable::operator|
            (&local_8f0,(PatternPipable *)&matchit::impl::pattern,&local_958);
  matchit::impl::
  PatternHelper<matchit::impl::Ds<matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Sum>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Id<mathiu::impl::Sum>>>>,matchit::impl::Wildcard>>
  ::operator+(&local_878,
              (PatternHelper<matchit::impl::Ds<matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Sum>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<mathiu::impl::Sum>>>>,matchit::impl::Wildcard>>
               *)&local_8f0,&local_888);
  local_a90.iSr = (Id<mathiu::impl::Sum> *)local_b0;
  local_a90.lhs = lhs;
  matchit::impl::Id<mathiu::impl::Sum>::Id
            ((Id<mathiu::impl::Sum> *)(local_ca0 + 0x90),local_a90.iSr);
  matchit::impl::as<mathiu::impl::Sum>::{lambda(auto:1)#1}::operator()
            (&local_bc8,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Sum>,
             (Id<mathiu::impl::Sum> *)(local_ca0 + 0x90));
  matchit::impl::
  ds<matchit::impl::Wildcard,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Sum>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<mathiu::impl::Sum>>>>>
            (&local_b60,(impl *)&matchit::impl::_,(Wildcard *)&local_bc8,patterns_1);
  matchit::impl::PatternPipable::operator|
            (&local_af8,(PatternPipable *)&matchit::impl::pattern,&local_b60);
  matchit::impl::
  PatternHelper<matchit::impl::Ds<matchit::impl::Wildcard,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Sum>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Id<mathiu::impl::Sum>>>>>>
  ::operator+((PatternPair<matchit::impl::Ds<matchit::impl::Wildcard,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:401:49)>
               *)local_a80,
              (PatternHelper<matchit::impl::Ds<matchit::impl::Wildcard,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Sum>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<mathiu::impl::Sum>>>>>>
               *)&local_af8,&local_a90);
  local_cb0.iil =
       (Id<int> *)
       ((long)&iir.mBlock.
               super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
               super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
               super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
               super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
               super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> +
       0x18);
  local_cb0.iir =
       (Id<int> *)
       ((long)&ii1.mBlock.
               super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
               super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
               super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
               super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
               super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> +
       0x18);
  matchit::impl::Id<int>::Id(&local_e10,local_cb0.iil);
  matchit::impl::as<int>::{lambda(auto:1)#1}::operator()
            (&local_df0,(_lambda_auto_1__1_ *)&matchit::impl::as<int>,&local_e10);
  matchit::impl::Id<int>::Id
            (&local_e70,
             (Id<int> *)
             ((long)&ii1.mBlock.
                     super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                     .
                     super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                     .
                     super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                     .
                     super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                     .
                     super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
             + 0x18));
  matchit::impl::as<int>::{lambda(auto:1)#1}::operator()
            (&local_e50,(_lambda_auto_1__1_ *)&matchit::impl::as<int>,&local_e70);
  matchit::impl::
  ds<matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<int>>>>,matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<int>>>>>
            (&local_db0,(impl *)&local_df0,&local_e50,
             (App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>
              *)patterns_1);
  matchit::impl::PatternPipable::operator|
            (&local_d30,(PatternPipable *)&matchit::impl::pattern,&local_db0);
  matchit::impl::
  PatternHelper<matchit::impl::Ds<matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Id<int>>>>,matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Id<int>>>>>>
  ::operator+((PatternPair<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:405:70)>
               *)local_ca0,
              (PatternHelper<matchit::impl::Ds<matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<int>>>>,matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<int>>>>>>
               *)&local_d30,&local_cb0);
  local_f40.iil =
       (Id<int> *)
       ((long)&iir.mBlock.
               super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
               super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
               super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
               super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
               super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> +
       0x18);
  local_f40.ii2 =
       (Id<int> *)
       ((long)&ii3.mBlock.
               super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
               super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
               super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
               super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
               super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> +
       0x18);
  local_f40.ii1 =
       (Id<int> *)
       ((long)&ii2.mBlock.
               super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
               super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
               super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
               super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
               super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> +
       0x18);
  matchit::impl::Id<int>::Id(&local_10e0,local_f40.iil);
  matchit::impl::as<int>::{lambda(auto:1)#1}::operator()
            (&local_10c0,(_lambda_auto_1__1_ *)&matchit::impl::as<int>,&local_10e0);
  matchit::impl::ds<matchit::impl::Id<int>,matchit::impl::Id<int>>
            ((Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_> *)(local_1238 + 0xb8),
             (impl *)((long)&ii2.mBlock.
                             super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                             .
                             super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                             .
                             super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                             .
                             super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                             .
                             super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                     + 0x18),
             (Id<int> *)
             ((long)&ii3.mBlock.
                     super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                     .
                     super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                     .
                     super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                     .
                     super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                     .
                     super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
             + 0x18),(Id<int> *)patterns_1);
  matchit::impl::as<mathiu::impl::Fraction>::{lambda(auto:1)#1}::operator()
            (&local_1140,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Fraction>,
             (Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_> *)(local_1238 + 0xb8));
  matchit::impl::
  ds<matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<int>>>>,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Fraction>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Ds<matchit::impl::Id<int>,matchit::impl::Id<int>>>>>>
            (&local_1080,(impl *)&local_10c0,
             (App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>
              *)&local_1140,
             (App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>
              *)patterns_1);
  matchit::impl::PatternPipable::operator|
            (&local_fe0,(PatternPipable *)&matchit::impl::pattern,&local_1080);
  matchit::impl::
  PatternHelper<matchit::impl::Ds<matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Id<int>>>>,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Fraction>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Ds<matchit::impl::Id<int>,matchit::impl::Id<int>>>>>>>
  ::operator+(&local_f28,
              (PatternHelper<matchit::impl::Ds<matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<int>>>>,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Fraction>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Ds<matchit::impl::Id<int>,matchit::impl::Id<int>>>>>>>
               *)&local_fe0,&local_f40);
  local_1250.iir =
       (Id<int> *)
       ((long)&ii1.mBlock.
               super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
               super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
               super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
               super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
               super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> +
       0x18);
  local_1250.ii2 =
       (Id<int> *)
       ((long)&ii3.mBlock.
               super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
               super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
               super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
               super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
               super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> +
       0x18);
  local_1250.ii1 =
       (Id<int> *)
       ((long)&ii2.mBlock.
               super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
               super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
               super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
               super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
               super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> +
       0x18);
  matchit::impl::ds<matchit::impl::Id<int>,matchit::impl::Id<int>>
            ((Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_> *)(local_1470 + 0x40),
             (impl *)local_1250.ii1,local_1250.ii2,(Id<int> *)patterns_1);
  matchit::impl::as<mathiu::impl::Fraction>::{lambda(auto:1)#1}::operator()
            (&local_13f0,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Fraction>,
             (Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_> *)(local_1470 + 0x40));
  matchit::impl::Id<int>::Id
            (&local_1490,
             (Id<int> *)
             ((long)&ii1.mBlock.
                     super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                     .
                     super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                     .
                     super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                     .
                     super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                     .
                     super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
             + 0x18));
  matchit::impl::as<int>::{lambda(auto:1)#1}::operator()
            ((App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>
              *)local_1470,(_lambda_auto_1__1_ *)&matchit::impl::as<int>,&local_1490);
  matchit::impl::
  ds<matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Fraction>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Ds<matchit::impl::Id<int>,matchit::impl::Id<int>>>>>,matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<int>>>>>
            (&local_1390,(impl *)&local_13f0,
             (App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>
              *)local_1470,
             (App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>
              *)patterns_1);
  matchit::impl::PatternPipable::operator|
            (&local_12f0,(PatternPipable *)&matchit::impl::pattern,&local_1390);
  matchit::impl::
  PatternHelper<matchit::impl::Ds<matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Fraction>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Ds<matchit::impl::Id<int>,matchit::impl::Id<int>>>>>,matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Id<int>>>>>>
  ::operator+((PatternPair<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:407:80)>
               *)local_1238,
              (PatternHelper<matchit::impl::Ds<matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Fraction>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Ds<matchit::impl::Id<int>,matchit::impl::Id<int>>>>>,matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<int>>>>>>
               *)&local_12f0,&local_1250);
  local_1590.ii1 =
       (Id<int> *)
       ((long)&ii2.mBlock.
               super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
               super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
               super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
               super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
               super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> +
       0x18);
  local_1590.ii4 =
       (Id<int> *)
       ((long)&coeff1.mBlock.
               super__Variant_base<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
               .
               super__Move_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
               .
               super__Copy_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
               .
               super__Move_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
               .
               super__Copy_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
       + 0x20);
  local_1590.ii2 =
       (Id<int> *)
       ((long)&ii3.mBlock.
               super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
               super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
               super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
               super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
               super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> +
       0x18);
  local_1590.ii3 =
       (Id<int> *)
       ((long)&ii4.mBlock.
               super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
               super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
               super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
               super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>.
               super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*> +
       0x18);
  matchit::impl::ds<matchit::impl::Id<int>,matchit::impl::Id<int>>
            (&local_17b0,(impl *)local_1590.ii1,local_1590.ii2,(Id<int> *)patterns_1);
  matchit::impl::as<mathiu::impl::Fraction>::{lambda(auto:1)#1}::operator()
            (&local_1770,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Fraction>,
             &local_17b0);
  matchit::impl::ds<matchit::impl::Id<int>,matchit::impl::Id<int>>
            (&local_1850,
             (impl *)((long)&ii4.mBlock.
                             super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                             .
                             super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                             .
                             super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                             .
                             super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                             .
                             super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                     + 0x18),
             (Id<int> *)
             ((long)&coeff1.mBlock.
                     super__Variant_base<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                     .
                     super__Move_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                     .
                     super__Copy_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                     .
                     super__Move_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                     .
                     super__Copy_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
             + 0x20),(Id<int> *)patterns_1);
  matchit::impl::as<mathiu::impl::Fraction>::{lambda(auto:1)#1}::operator()
            (&local_1810,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Fraction>,
             &local_1850);
  matchit::impl::
  ds<matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Fraction>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Ds<matchit::impl::Id<int>,matchit::impl::Id<int>>>>>,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Fraction>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Ds<matchit::impl::Id<int>,matchit::impl::Id<int>>>>>>
            (&local_1710,(impl *)&local_1770,&local_1810,
             (App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>
              *)patterns_1);
  matchit::impl::PatternPipable::operator|
            (&local_1650,(PatternPipable *)&matchit::impl::pattern,&local_1710);
  matchit::impl::
  PatternHelper<matchit::impl::Ds<matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Fraction>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Ds<matchit::impl::Id<int>,matchit::impl::Id<int>>>>>,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Fraction>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Ds<matchit::impl::Id<int>,matchit::impl::Id<int>>>>>>>
  ::operator+(&local_1570,
              (PatternHelper<matchit::impl::Ds<matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Fraction>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Ds<matchit::impl::Id<int>,matchit::impl::Id<int>>>>>,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Fraction>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Ds<matchit::impl::Id<int>,matchit::impl::Id<int>>>>>>>
               *)&local_1650,&local_1590);
  local_18c0.iPieceWise = (Id<mathiu::impl::PieceWise> *)(local_238 + 0x10);
  local_18c0.rhs = rhs;
  matchit::impl::Id<mathiu::impl::PieceWise>::Id
            ((Id<mathiu::impl::PieceWise> *)(local_1a40 + 0x60),local_18c0.iPieceWise);
  matchit::impl::as<mathiu::impl::PieceWise>::{lambda(auto:1)#1}::operator()
            (&local_19b0,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::PieceWise>,
             (Id<mathiu::impl::PieceWise> *)(local_1a40 + 0x60));
  matchit::impl::
  ds<matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::PieceWise>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<mathiu::impl::PieceWise>>>>,matchit::impl::Wildcard>
            (&local_1960,(impl *)&local_19b0,
             (App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>
              *)&matchit::impl::_,(Wildcard *)patterns_1);
  matchit::impl::PatternPipable::operator|
            (&local_1910,(PatternPipable *)&matchit::impl::pattern,&local_1960);
  matchit::impl::
  PatternHelper<matchit::impl::Ds<matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::PieceWise>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Id<mathiu::impl::PieceWise>>>>,matchit::impl::Wildcard>>
  ::operator+(&local_18b0,
              (PatternHelper<matchit::impl::Ds<matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::PieceWise>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<mathiu::impl::PieceWise>>>>,matchit::impl::Wildcard>>
               *)&local_1910,&local_18c0);
  local_1a50.iPieceWise = (Id<mathiu::impl::PieceWise> *)(local_238 + 0x10);
  local_1a50.lhs = lhs;
  matchit::impl::Id<mathiu::impl::PieceWise>::Id(&local_1b70,local_1a50.iPieceWise);
  matchit::impl::as<mathiu::impl::PieceWise>::{lambda(auto:1)#1}::operator()
            (&local_1b40,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::PieceWise>,
             &local_1b70);
  matchit::impl::
  ds<matchit::impl::Wildcard,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::PieceWise>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<mathiu::impl::PieceWise>>>>>
            (&local_1af0,(impl *)&matchit::impl::_,(Wildcard *)&local_1b40,
             (App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>
              *)patterns_1);
  matchit::impl::PatternPipable::operator|
            (&local_1aa0,(PatternPipable *)&matchit::impl::pattern,&local_1af0);
  matchit::impl::
  PatternHelper<matchit::impl::Ds<matchit::impl::Wildcard,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::PieceWise>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Id<mathiu::impl::PieceWise>>>>>>
  ::operator+((PatternPair<matchit::impl::Ds<matchit::impl::Wildcard,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:414:62)>
               *)local_1a40,
              (PatternHelper<matchit::impl::Ds<matchit::impl::Wildcard,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::PieceWise>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<mathiu::impl::PieceWise>>>>>>
               *)&local_1aa0,&local_1a50);
  local_1c50.coeff1 =
       (Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)
       ((long)&coeff2.mBlock.
               super__Variant_base<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
               .
               super__Move_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
               .
               super__Copy_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
               .
               super__Move_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
               .
               super__Copy_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
       + 0x20);
  local_1c50.coeff2 =
       (Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)
       ((long)&rest.mBlock.
               super__Variant_base<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
               .
               super__Move_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
               .
               super__Copy_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
               .
               super__Move_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
               .
               super__Copy_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
       + 0x20);
  local_1c50.rest =
       (Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)
       ((long)&iPieceWise.mBlock.
               super__Variant_base<matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
               .
               super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
               .
               super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
               .
               super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
               .
               super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
       + 0x28);
  asCoeffAndRest::{lambda(auto:1&&,auto:2&&)#1}::operator()
            (&local_1e08,&asCoeffAndRest,local_1c50.coeff1,local_1c50.rest);
  patterns_1_00 =
       (App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
        *)((long)&iPieceWise.mBlock.
                  super__Variant_base<matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
                  .
                  super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
                  .
                  super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
                  .
                  super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
                  .
                  super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
          + 0x28);
  asCoeffAndRest::{lambda(auto:1&&,auto:2&&)#1}::operator()
            (&local_1e60,&asCoeffAndRest,
             (Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)
             ((long)&rest.mBlock.
                     super__Variant_base<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                     .
                     super__Move_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                     .
                     super__Copy_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                     .
                     super__Move_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                     .
                     super__Copy_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
             + 0x20),(Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)patterns_1_00);
  matchit::impl::
  ds<matchit::impl::App<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>(&)(mathiu::impl::Expr_const&),matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>>,matchit::impl::App<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>(&)(mathiu::impl::Expr_const&),matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>>>
            (&local_1db0,(impl *)&local_1e08,&local_1e60,patterns_1_00);
  matchit::impl::PatternPipable::operator|
            (&local_1d00,(PatternPipable *)&matchit::impl::pattern,&local_1db0);
  matchit::impl::
  PatternHelper<matchit::impl::Ds<matchit::impl::App<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>(&)(mathiu::impl::Expr_const&),matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>>,matchit::impl::App<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>(&)(mathiu::impl::Expr_const&),matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>>>>
  ::operator+(&local_1c38,
              (PatternHelper<matchit::impl::Ds<matchit::impl::App<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>(&)(mathiu::impl::Expr_const&),matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>>,matchit::impl::App<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>(&)(mathiu::impl::Expr_const&),matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>>>>
               *)&local_1d00,&local_1c50);
  local_1e88.lhs = lhs;
  local_1e88.rhs = rhs;
  matchit::impl::PatternPipable::operator|
            ((PatternPipable *)&matchit::impl::pattern,(Wildcard *)&matchit::impl::_);
  matchit::impl::PatternHelper<matchit::impl::Wildcard>::operator+
            (&local_1e78,&local_1e89,&local_1e88);
  matchit::impl::
  MatchHelper<std::tuple<const_mathiu::impl::Expr_&,_const_mathiu::impl::Expr_&>,_false>::
  operator()<_12da6c8_>
            ((MatchHelper<std::tuple<const_mathiu::impl::Expr_&,_const_mathiu::impl::Expr_&>,_false>
              *)this,(PatternPair<matchit::impl::PostCheck<matchit::impl::Wildcard,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:388:37)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:388:70)>
                      *)local_238,
             (PatternPair<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>_>,_matchit::impl::Wildcard>,_matchit::impl::Nullary<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:110:28)>_>
              *)local_260,
             (PatternPair<matchit::impl::Ds<matchit::impl::Wildcard,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>_>_>,_matchit::impl::Nullary<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:110:28)>_>
              *)&local_2e0,
             (PatternPair<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:395:60)>
              *)local_390,
             (PatternPair<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_matchit::impl::Wildcard>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:398:49)>
              *)&local_4f0,
             (PatternPair<matchit::impl::Ds<matchit::impl::Wildcard,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:401:49)>
              *)&local_878,
             (PatternPair<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:405:70)>
              *)local_a80,
             (PatternPair<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:406:80)>
              *)local_ca0,
             (PatternPair<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<int>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:407:80)>
              *)&local_f28,
             (PatternPair<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Fraction>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Id<int>,_matchit::impl::Id<int>_>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:408:90)>
              *)local_1238,
             (PatternPair<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>,_matchit::impl::Wildcard>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:410:62)>
              *)&local_1570,
             (PatternPair<matchit::impl::Ds<matchit::impl::Wildcard,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:414:62)>
              *)&local_18b0,
             (PatternPair<matchit::impl::Ds<matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:419:92)>
              *)local_1a40,
             (PatternPair<matchit::impl::Wildcard,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:423:58)>
              *)&local_1c38);
  matchit::impl::
  PatternPair<matchit::impl::Ds<matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/src/core.cpp:419:92)>
  ::~PatternPair(&local_1c38);
  matchit::impl::
  PatternHelper<matchit::impl::Ds<matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>
  ::~PatternHelper(&local_1d00);
  matchit::impl::
  Ds<matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_matchit::impl::App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
  ::~Ds(&local_1db0);
  matchit::impl::
  App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
  ::~App(&local_1e60);
  matchit::impl::
  App<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_(&)(const_mathiu::impl::Expr_&),_matchit::impl::Ds<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
  ::~App(&local_1e08);
  matchit::impl::
  PatternPair<matchit::impl::Ds<matchit::impl::Wildcard,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/src/core.cpp:414:62)>
  ::~PatternPair((PatternPair<matchit::impl::Ds<matchit::impl::Wildcard,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:414:62)>
                  *)local_1a40);
  matchit::impl::
  PatternHelper<matchit::impl::Ds<matchit::impl::Wildcard,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>_>_>
  ::~PatternHelper(&local_1aa0);
  matchit::impl::
  Ds<matchit::impl::Wildcard,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>_>
  ::~Ds(&local_1af0);
  matchit::impl::
  App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>
  ::~App(&local_1b40);
  matchit::impl::Id<mathiu::impl::PieceWise>::~Id(&local_1b70);
  matchit::impl::
  PatternPair<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>,_matchit::impl::Wildcard>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/src/core.cpp:410:62)>
  ::~PatternPair(&local_18b0);
  matchit::impl::
  PatternHelper<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>,_matchit::impl::Wildcard>_>
  ::~PatternHelper(&local_1910);
  matchit::impl::
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>,_matchit::impl::Wildcard>
  ::~Ds(&local_1960);
  matchit::impl::
  App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>
  ::~App(&local_19b0);
  matchit::impl::Id<mathiu::impl::PieceWise>::~Id
            ((Id<mathiu::impl::PieceWise> *)(local_1a40 + 0x60));
  matchit::impl::
  PatternPair<matchit::impl::Ds<matchit::impl::Wildcard,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/src/core.cpp:401:49)>
  ::~PatternPair((PatternPair<matchit::impl::Ds<matchit::impl::Wildcard,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:401:49)>
                  *)local_a80);
  matchit::impl::
  PatternHelper<matchit::impl::Ds<matchit::impl::Wildcard,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>_>
  ::~PatternHelper(&local_af8);
  matchit::impl::
  Ds<matchit::impl::Wildcard,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>
  ::~Ds(&local_b60);
  matchit::impl::
  App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>
  ::~App(&local_bc8);
  matchit::impl::Id<mathiu::impl::Sum>::~Id((Id<mathiu::impl::Sum> *)(local_ca0 + 0x90));
  matchit::impl::
  PatternPair<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_matchit::impl::Wildcard>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/src/core.cpp:398:49)>
  ::~PatternPair(&local_878);
  matchit::impl::
  PatternHelper<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_matchit::impl::Wildcard>_>
  ::~PatternHelper(&local_8f0);
  matchit::impl::
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_matchit::impl::Wildcard>
  ::~Ds(&local_958);
  matchit::impl::
  App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>
  ::~App(&local_9c0);
  matchit::impl::Id<mathiu::impl::Sum>::~Id((Id<mathiu::impl::Sum> *)(local_a80 + 0x78));
  matchit::impl::
  PatternPair<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/src/core.cpp:395:60)>
  ::~PatternPair(&local_4f0);
  matchit::impl::
  PatternHelper<matchit::impl::Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>_>
  ::~PatternHelper(&local_5d0);
  matchit::impl::
  Ds<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>
  ::~Ds(&local_6a0);
  matchit::impl::
  App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>
  ::~App(&local_7b8);
  matchit::impl::Id<mathiu::impl::Sum>::~Id(&local_800);
  matchit::impl::
  App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>
  ::~App(&local_708);
  matchit::impl::Id<mathiu::impl::Sum>::~Id(&local_750);
  matchit::impl::Id<mathiu::impl::PieceWise>::~Id((Id<mathiu::impl::PieceWise> *)(local_238 + 0x10))
  ;
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::~Id
            ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)
             ((long)&iPieceWise.mBlock.
                     super__Variant_base<matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
                     .
                     super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
                     .
                     super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
                     .
                     super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
                     .
                     super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
             + 0x28));
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::~Id
            ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)
             ((long)&rest.mBlock.
                     super__Variant_base<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                     .
                     super__Move_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                     .
                     super__Copy_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                     .
                     super__Move_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                     .
                     super__Copy_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
             + 0x20));
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::~Id
            ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)
             ((long)&coeff2.mBlock.
                     super__Variant_base<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                     .
                     super__Move_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                     .
                     super__Copy_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                     .
                     super__Move_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                     .
                     super__Copy_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
             + 0x20));
  matchit::impl::Id<mathiu::impl::Sum>::~Id((Id<mathiu::impl::Sum> *)local_b0);
  matchit::impl::Id<mathiu::impl::Sum>::~Id
            ((Id<mathiu::impl::Sum> *)
             ((long)&iSr.mBlock.
                     super__Variant_base<matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                     .
                     super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                     .
                     super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                     .
                     super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                     .
                     super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
             + 0x40));
  EVar2.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar2.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ExprPtr)EVar2.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ExprPtr operator+(ExprPtr const &lhs, ExprPtr const &rhs)
    {
#if VERBOSE_DEBUG
        std::cout << "operator+: " << toString(lhs) << "\t" << toString(rhs) << std::endl;
#endif // VERBOSE_DEBUG
        Id<Sum> iSl, iSr;
        Id<Integer> iil, iir;
        Id<Integer> ii1, ii2, ii3, ii4;
        Id<ExprPtr> coeff1, coeff2, rest;
        Id<PieceWise> iPieceWise;
        return match(*lhs, *rhs)(
            // clang-format off
                // basic commutative transformation
                pattern | _ | when ([&]{ return less(rhs, lhs); }) = [&] {
                    return rhs + lhs;
                },
                // basic identity transformation
                pattern | ds(as<Integer>(0), _) = expr(rhs),
                pattern | ds(_, as<Integer>(0)) = expr(lhs),
                // basic associative transformation
                pattern | ds(as<Sum>(iSl), as<Sum>(iSr)) = [&] {
                    return mergeSum(*iSl, *iSr);
                },
                pattern | ds(as<Sum>(iSl), _) = [&] {
                    return insertSum(*iSl, rhs);
                },
                pattern | ds(_, as<Sum>(iSr)) = [&] {
                    return insertSum(*iSr, lhs);
                },
                // basic distributive transformation
                pattern | ds(as<Integer>(iil), as<Integer>(iir))   = [&] { return integer(*iil + *iir); },
                pattern | ds(as<Integer>(iil), as<Fraction>(ds(ii1, ii2)))   = [&] { return simplifyRational(fraction(*iil * *ii2 + *ii1, *ii2)); },
                pattern | ds(as<Fraction>(ds(ii1, ii2)), as<Integer>(iir))   = [&] { return simplifyRational(fraction(*iir * *ii2 + *ii1, *ii2)); },
                pattern | ds(as<Fraction>(ds(ii1, ii2)), as<Fraction>(ds(ii3, ii4)))   = [&] { return simplifyRational(fraction(*ii1 * *ii4 + *ii2 * *ii3, *ii2 * *ii4)); },
                // piecewise
                pattern | ds(as<PieceWise>(iPieceWise), _) = [&]
                {
                    return transformPieceWise(*iPieceWise, [&](auto&& e) { return e + rhs; });
                },
                pattern | ds(_, as<PieceWise>(iPieceWise)) = [&]
                {
                    return transformPieceWise(*iPieceWise, [&](auto&& e) { return lhs + e; });
                },
                // basic distributive transformation
                pattern | ds(asCoeffAndRest(coeff1, rest), asCoeffAndRest(coeff2, rest)) = [&]
                {
                    return ((*coeff1) + (*coeff2)) * (*rest);
                },
                pattern | _                            = [&] { return makeSharedExprPtr(Sum{{{coeffAndTerm(*lhs).second, lhs}, {coeffAndTerm(*rhs).second, rhs}}}); }
            // clang-format on
        );
    }